

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::AdamOptimizer::_InternalParse
          (AdamOptimizer *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *this_00;
  bool bVar1;
  Int64Parameter *msg;
  DoubleParameter *pDVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint local_24;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  AdamOptimizer *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)google::protobuf::internal::ReadTag((char *)ctx_local,&local_24,0);
    this_00 = pPStack_20;
    tag_00 = local_24;
    switch(local_24 >> 3) {
    case 1:
      if ((local_24 & 0xff) != 10) break;
      pDVar2 = _internal_mutable_learningrate(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (this_00,&pDVar2->super_MessageLite,(char *)ctx_local);
      goto joined_r0x0036746e;
    case 2:
      if ((local_24 & 0xff) == 0x12) {
        msg = _internal_mutable_minibatchsize(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (this_00,&msg->super_MessageLite,(char *)ctx_local);
        goto joined_r0x0036746e;
      }
      break;
    case 3:
      if ((local_24 & 0xff) == 0x1a) {
        pDVar2 = _internal_mutable_beta1(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (this_00,&pDVar2->super_MessageLite,(char *)ctx_local);
        goto joined_r0x0036746e;
      }
      break;
    case 4:
      if ((local_24 & 0xff) == 0x22) {
        pDVar2 = _internal_mutable_beta2(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (this_00,&pDVar2->super_MessageLite,(char *)ctx_local);
        goto joined_r0x0036746e;
      }
      break;
    case 5:
      if ((local_24 & 0xff) == 0x2a) {
        pDVar2 = _internal_mutable_eps(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (this_00,&pDVar2->super_MessageLite,(char *)ctx_local);
        goto joined_r0x0036746e;
      }
    }
    if ((local_24 == 0) || ((local_24 & 7) == 4)) {
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_20->super_EpsCopyInputStream,local_24);
      return (char *)ctx_local;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
joined_r0x0036746e:
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* AdamOptimizer::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.DoubleParameter learningRate = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_learningrate(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Parameter miniBatchSize = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_minibatchsize(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.DoubleParameter beta1 = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_beta1(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.DoubleParameter beta2 = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_beta2(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.DoubleParameter eps = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_eps(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}